

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

Type GradientBaseFP::fetchSingle(QGradientData *gradient,int v)

{
  QRgbaFloat32 QVar1;
  Type TVar2;
  int in_stack_00000014;
  QGradientData *in_stack_00000018;
  
  QVar1 = qt_gradient_pixelFP_fixed(in_stack_00000018,in_stack_00000014);
  TVar2.r = QVar1.r;
  TVar2.g = QVar1.g;
  TVar2.b = QVar1.b;
  TVar2.a = QVar1.a;
  return TVar2;
}

Assistant:

static Type fetchSingle(const QGradientData& gradient, int v)
    {
        return qt_gradient_pixelFP_fixed(&gradient, v);
    }